

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
::emplace<std::pair<slang::BufferID,unsigned_long>>
          (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
           *this,pair<slang::BufferID,_unsigned_long> *key)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
  pVar2;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
  pVar3;
  bool local_49;
  templated_iterator<std::pair<slang::BufferID,_unsigned_long>_> local_48;
  char local_39;
  EntryPointer psStack_38;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  pair<slang::BufferID,_unsigned_long> *key_local;
  sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
  *this_local;
  bool local_10;
  
  index = (size_t)key;
  key_local = (pair<slang::BufferID,_unsigned_long> *)this;
  hash = hash_object<std::pair<slang::BufferID,unsigned_long>>(this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x18),hash,*(size_t *)(this + 0x10));
  psStack_38 = (EntryPointer)(*(long *)(this + 8) + (long)current_entry * 0x18);
  local_39 = '\0';
  do {
    if (psStack_38->distance_from_desired < local_39) {
      pVar2 = emplace_new_key<std::pair<slang::BufferID,unsigned_long>>
                        (this,local_39,psStack_38,(pair<slang::BufferID,_unsigned_long> *)index);
      local_10 = pVar2.second;
LAB_0028164f:
      this_local = (sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
                    *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<std::pair<slang::BufferID,unsigned_long>,std::pair<slang::BufferID,unsigned_long>>
                      (this,(pair<slang::BufferID,_unsigned_long> *)index,
                       &(psStack_38->field_1).value);
    if (bVar1) {
      sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
      ::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>::templated_iterator
                (&local_48,psStack_38);
      local_49 = false;
      std::
      pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
      ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
                          *)&this_local,&local_48,&local_49);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_0028164f;
    }
    psStack_38 = psStack_38 + 1;
    local_39 = local_39 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }